

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v11::detail::digit_grouping<char>::next(digit_grouping<char> *this,next_state *state)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  const_reference pvVar4;
  reference pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  char *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int local_4;
  
  local_18 = in_RSI;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33aff1);
  if (bVar1) {
    local_4 = max_value<int>();
  }
  else {
    this_00 = local_18;
    local_20 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 (local_18);
    bVar1 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    if (bVar1) {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_4 = (int)*pvVar4 + (int)local_18->_M_string_length;
      *(int *)&local_18->_M_string_length = local_4;
    }
    else {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_18);
      if ('\0' < *pcVar5) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_18);
        iVar3 = (int)*pcVar5;
        cVar2 = max_value<char>();
        if (iVar3 != cVar2) {
          local_28 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)this_00,iVar3);
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28);
          *(int *)&local_18->_M_string_length = (int)*pcVar5 + (int)local_18->_M_string_length;
          return (int)local_18->_M_string_length;
        }
      }
      local_4 = max_value<int>();
    }
  }
  return local_4;
}

Assistant:

auto next(next_state& state) const -> int {
    if (thousands_sep_.empty()) return max_value<int>();
    if (state.group == grouping_.end()) return state.pos += grouping_.back();
    if (*state.group <= 0 || *state.group == max_value<char>())
      return max_value<int>();
    state.pos += *state.group++;
    return state.pos;
  }